

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_converter_process_pcm_frames__channels_only
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_channel_converter *pConverter_00;
  ma_format formatOut;
  int iVar1;
  ma_result mVar2;
  ulong uVar3;
  ulong uVar4;
  ulong frameCount;
  ulong frameCount_00;
  undefined1 *pFramesOut_00;
  void *pIn;
  byte bVar5;
  undefined1 *pOut;
  ulong uVar6;
  ma_uint8 pTempBufferIn [4096];
  ma_uint8 pTempBufferOut [4096];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  if (pFrameCountIn == (ma_uint64 *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *pFrameCountIn;
  }
  if (pFrameCountOut == (ma_uint64 *)0x0) {
    frameCount = 0;
  }
  else {
    frameCount = *pFrameCountOut;
  }
  if (uVar6 < frameCount) {
    frameCount = uVar6;
  }
  pConverter_00 = &pConverter->channelConverter;
  if ((pConverter->field_0x2768 & 3) == 0) {
    mVar2 = ma_channel_converter_process_pcm_frames(pConverter_00,pFramesOut,pFramesIn,frameCount);
    if (mVar2 != 0) {
      return mVar2;
    }
  }
  else {
    for (uVar6 = 0; uVar4 = frameCount - uVar6, uVar6 <= frameCount && uVar4 != 0;
        uVar6 = uVar6 + frameCount_00) {
      formatOut = (pConverter->channelConverter).format;
      frameCount_00 =
           0x1000 / (ulong)((pConverter->channelConverter).channelsOut *
                           *(int *)(&DAT_001127b0 + (ulong)formatOut * 4));
      if (pFramesIn == (void *)0x0) {
        pIn = (void *)0x0;
      }
      else {
        pIn = (void *)((*(int *)(&DAT_001127b0 + (ulong)(pConverter->config).formatIn * 4) *
                       (pConverter->config).channelsIn) * uVar6 + (long)pFramesIn);
      }
      if (pFramesOut == (void *)0x0) {
        pOut = (undefined1 *)0x0;
      }
      else {
        pOut = (undefined1 *)
               ((*(int *)(&DAT_001127b0 + (ulong)(pConverter->config).formatOut * 4) *
                (pConverter->config).channelsOut) * uVar6 + (long)pFramesOut);
      }
      bVar5 = pConverter->field_0x2768;
      if ((bVar5 & 1) == 0) {
        if ((bVar5 & 2) == 0) {
          __assert_fail("pConverter->hasPostFormatConversion == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                        ,0x87f8,
                        "ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                       );
        }
        if (uVar4 < frameCount_00) {
          frameCount_00 = uVar4;
        }
        iVar1 = ma_channel_converter_process_pcm_frames(pConverter_00,local_1038,pIn,frameCount_00);
      }
      else {
        uVar3 = 0x1000 / (ulong)(*(int *)(&DAT_001127b0 + (ulong)formatOut * 4) *
                                (pConverter->channelConverter).channelsIn);
        if (uVar4 < uVar3) {
          uVar3 = uVar4;
        }
        if (uVar3 < frameCount_00) {
          frameCount_00 = uVar3;
        }
        if ((bVar5 & 2) == 0) {
          frameCount_00 = uVar3;
        }
        if (pIn == (void *)0x0) {
          memset(local_2038,0,0x1000);
        }
        else {
          ma_convert_pcm_frames_format
                    (local_2038,formatOut,pIn,(pConverter->config).formatIn,frameCount_00,
                     (pConverter->config).channelsIn,(pConverter->config).ditherMode);
          bVar5 = pConverter->field_0x2768;
        }
        pFramesOut_00 = pOut;
        if ((bVar5 & 2) != 0) {
          pFramesOut_00 = local_1038;
        }
        iVar1 = ma_channel_converter_process_pcm_frames
                          (pConverter_00,pFramesOut_00,local_2038,frameCount_00);
      }
      if (iVar1 != 0) break;
      if (((pConverter->field_0x2768 & 2) != 0) && (pOut != (undefined1 *)0x0)) {
        ma_convert_pcm_frames_format
                  (pOut,(pConverter->config).formatOut,local_1038,
                   (pConverter->channelConverter).format,frameCount_00,
                   (pConverter->channelConverter).channelsOut,(pConverter->config).ditherMode);
      }
    }
  }
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = frameCount;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = frameCount;
  }
  return 0;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__channels_only(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_result result;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 frameCount;

    MA_ASSERT(pConverter != NULL);

    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    frameCount = ma_min(frameCountIn, frameCountOut);

    if (pConverter->hasPreFormatConversion == MA_FALSE && pConverter->hasPostFormatConversion == MA_FALSE) {
        /* No format conversion required. */
        result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOut, pFramesIn, frameCount);
        if (result != MA_SUCCESS) {
            return result;
        }
    } else {
        /* Format conversion required. */
        ma_uint64 framesProcessed = 0;

        while (framesProcessed < frameCount) {
            ma_uint8 pTempBufferOut[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
            const ma_uint32 tempBufferOutCap = sizeof(pTempBufferOut) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsOut);
            const void* pFramesInThisIteration;
            /* */ void* pFramesOutThisIteration;
            ma_uint64 frameCountThisIteration;

            if (pFramesIn != NULL) {
                pFramesInThisIteration = ma_offset_ptr(pFramesIn, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatIn, pConverter->config.channelsIn));
            } else {
                pFramesInThisIteration = NULL;
            }

            if (pFramesOut != NULL) {
                pFramesOutThisIteration = ma_offset_ptr(pFramesOut, framesProcessed * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
            } else {
                pFramesOutThisIteration = NULL;
            }

            /* Do a pre format conversion if necessary. */
            if (pConverter->hasPreFormatConversion) {
                ma_uint8 pTempBufferIn[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                const ma_uint32 tempBufferInCap = sizeof(pTempBufferIn) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsIn);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferInCap) {
                    frameCountThisIteration = tempBufferInCap;
                }

                if (pConverter->hasPostFormatConversion) {
                    if (frameCountThisIteration > tempBufferOutCap) {
                        frameCountThisIteration = tempBufferOutCap;
                    }
                }

                if (pFramesInThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pTempBufferIn, pConverter->channelConverter.format, pFramesInThisIteration, pConverter->config.formatIn, frameCountThisIteration, pConverter->config.channelsIn, pConverter->config.ditherMode);
                } else {
                    MA_ZERO_MEMORY(pTempBufferIn, sizeof(pTempBufferIn));
                }

                if (pConverter->hasPostFormatConversion) {
                    /* Both input and output conversion required. Output to the temp buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pTempBufferIn, frameCountThisIteration);
                } else {
                    /* Only pre-format required. Output straight to the output buffer. */
                    result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pFramesOutThisIteration, pTempBufferIn, frameCountThisIteration);
                }

                if (result != MA_SUCCESS) {
                    break;
                }
            } else {
                /* No pre-format required. Just read straight from the input buffer. */
                MA_ASSERT(pConverter->hasPostFormatConversion == MA_TRUE);

                frameCountThisIteration = (frameCount - framesProcessed);
                if (frameCountThisIteration > tempBufferOutCap) {
                    frameCountThisIteration = tempBufferOutCap;
                }

                result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pTempBufferOut, pFramesInThisIteration, frameCountThisIteration);
                if (result != MA_SUCCESS) {
                    break;
                }
            }

            /* If we are doing a post format conversion we need to do that now. */
            if (pConverter->hasPostFormatConversion) {
                if (pFramesOutThisIteration != NULL) {
                    ma_convert_pcm_frames_format(pFramesOutThisIteration, pConverter->config.formatOut, pTempBufferOut, pConverter->channelConverter.format, frameCountThisIteration, pConverter->channelConverter.channelsOut, pConverter->config.ditherMode);
                }
            }

            framesProcessed += frameCountThisIteration;
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = frameCount;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = frameCount;
    }

    return MA_SUCCESS;
}